

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_serializer_boost_po.h
# Opt level: O1

void __thiscall
VW::config::options_serializer_boost_po::serialize<float>
          (options_serializer_boost_po *this,
          typed_option<std::vector<float,_std::allocator<float>_>_> *typed_option)

{
  vector<float,_std::allocator<float>_> *__x;
  pointer pfVar1;
  iterator __begin0;
  pointer pfVar2;
  undefined1 *puVar3;
  vector<float,_std::allocator<float>_> vec;
  vector<float,_std::allocator<float>_> local_48;
  
  __x = (typed_option->m_value).
        super___shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr;
  if (__x == (vector<float,_std::allocator<float>_> *)0x0) {
    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (float *)0x0;
    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (float *)0x0;
    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
  }
  else {
    std::vector<float,_std::allocator<float>_>::vector(&local_48,__x);
  }
  pfVar1 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    puVar3 = &this->field_0x18;
    pfVar2 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar3," --",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)puVar3,(typed_option->super_base_option).m_name._M_dataplus._M_p,
                 (typed_option->super_base_option).m_name._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar3," ",1);
      std::ostream::_M_insert<double>((double)*pfVar2);
      pfVar2 = pfVar2 + 1;
    } while (pfVar2 != pfVar1);
  }
  if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void serialize(typed_option<std::vector<T>> typed_option)
  {
    auto vec = typed_option.value();
    if (vec.size() > 0)
    {
      for (auto const& value : vec)
      {
        m_output_stream << " --" << typed_option.m_name;
        m_output_stream << " " << value;
      }
    }
  }